

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_mapping_sort_cmp_default(fy_node_pair *fynp_a,fy_node_pair *fynp_b,void *arg)

{
  fy_node *pfVar1;
  fy_node *pfVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar8;
  fy_token *pfVar9;
  int iVar10;
  undefined7 uVar11;
  code *UNRECOVERED_JUMPTABLE;
  bool bVar12;
  bool bVar13;
  
  if (arg == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = fy_node_scalar_cmp_default;
    uVar7 = 0;
  }
  else {
    UNRECOVERED_JUMPTABLE = *arg;
    uVar7 = *(undefined8 *)((long)arg + 8);
  }
  pfVar1 = fynp_a->key;
  bVar13 = true;
  bVar12 = true;
  if (pfVar1 != (fy_node *)0x0) {
    bVar12 = (pfVar1->field_0x34 & 3) == 0;
  }
  pfVar2 = fynp_b->key;
  if (pfVar2 != (fy_node *)0x0) {
    bVar13 = (pfVar2->field_0x34 & 3) == 0;
  }
  uVar11 = (undefined7)((ulong)fynp_a >> 8);
  if (((bool)(bVar12 ^ 1U)) || ((bool)(bVar13 ^ 1U))) {
    iVar4 = -1;
    if (((bool)(bVar12 | bVar13 ^ 1U)) && (iVar4 = 1, (bool)(bVar12 ^ 1U | bVar13))) {
      bVar3 = pfVar1->field_0x34 & 3;
      if (bVar3 == (pfVar2->field_0x34 & 3)) {
        pfVar9 = (fynp_a->parent->field_12).scalar;
        paVar8 = &fynp_a->parent->field_12;
        iVar4 = -1;
        iVar6 = -1;
        if (pfVar9 != (fy_token *)0x0 && pfVar9 != (fy_token *)paVar8) {
          iVar6 = 0;
          do {
            if (pfVar9 == (fy_token *)fynp_a) goto LAB_0011d801;
            pfVar9 = (fy_token *)(pfVar9->node).next;
          } while ((pfVar9 != (fy_token *)paVar8) && (iVar6 = iVar6 + 1, pfVar9 != (fy_token *)0x0))
          ;
          iVar6 = -1;
        }
LAB_0011d801:
        pfVar9 = (fynp_b->parent->field_12).scalar;
        paVar8 = &fynp_b->parent->field_12;
        iVar5 = iVar4;
        if (pfVar9 != (fy_token *)0x0 && pfVar9 != (fy_token *)paVar8) {
          iVar10 = 0;
          do {
            iVar5 = iVar10;
            if ((pfVar9 == (fy_token *)fynp_b) ||
               (pfVar9 = (fy_token *)(pfVar9->node).next, iVar5 = iVar4,
               pfVar9 == (fy_token *)paVar8)) break;
            iVar10 = iVar10 + 1;
          } while (pfVar9 != (fy_token *)0x0);
        }
        iVar4 = 1;
        if (iVar6 <= iVar5) {
          iVar4 = -(uint)(iVar6 < iVar5);
        }
      }
      else {
        iVar4 = (uint)(bVar3 != 2) * 2 + -1;
      }
    }
  }
  else {
    if ((pfVar1 == (fy_node *)0x0) || ((pfVar1->field_0x34 & 3) != 0)) {
      bVar13 = false;
    }
    else {
      bVar13 = pfVar1->style == FYNS_ALIAS;
    }
    if ((pfVar2 == (fy_node *)0x0) || ((pfVar2->field_0x34 & 3) != 0)) {
      bVar12 = false;
      uVar11 = 0;
    }
    else {
      bVar12 = pfVar2->style == FYNS_ALIAS;
    }
    if ((!bVar13) || (iVar4 = -1, bVar12 != false)) {
      iVar4 = 1;
      if (bVar13 || (~bVar12 & 1U) != 0) {
        iVar4 = (*UNRECOVERED_JUMPTABLE)
                          (pfVar1,pfVar2,uVar7,pfVar2,CONCAT71(uVar11,~bVar12),UNRECOVERED_JUMPTABLE
                          );
        return iVar4;
      }
    }
  }
  return iVar4;
}

Assistant:

static int fy_node_mapping_sort_cmp_default(const struct fy_node_pair *fynp_a,
                                            const struct fy_node_pair *fynp_b,
                                            void *arg) {
    int idx_a, idx_b;
    bool alias_a, alias_b, scalar_a, scalar_b;
    struct fy_node_cmp_arg *cmp_arg;
    fy_node_scalar_compare_fn cmp_fn;
    void *cmp_fn_arg;

    cmp_arg = arg;
    cmp_fn = cmp_arg ? cmp_arg->cmp_fn : fy_node_scalar_cmp_default;
    cmp_fn_arg = cmp_arg ? cmp_arg->arg : NULL;

    /* order is: maps first, followed by sequences, and last scalars sorted */
    scalar_a = !fynp_a->key || fy_node_is_scalar(fynp_a->key);
    scalar_b = !fynp_b->key || fy_node_is_scalar(fynp_b->key);

    /* scalar? perform comparison */
    if (scalar_a && scalar_b) {

        /* if both are aliases, sort skipping the '*' */
        alias_a = fy_node_is_alias(fynp_a->key);
        alias_b = fy_node_is_alias(fynp_b->key);

        /* aliases win */
        if (alias_a && !alias_b)
            return -1;

        if (!alias_a && alias_b)
            return 1;

        return cmp_fn(fynp_a->key, fynp_b->key, cmp_fn_arg);
    }

    /* b is scalar, a is not */
    if (!scalar_a && scalar_b)
        return -1;

    /* a is scalar, b is not */
    if (scalar_a && !scalar_b)
        return 1;

    /* different types, mappings win */
    if (fynp_a->key->type != fynp_b->key->type)
        return fynp_a->key->type == FYNT_MAPPING ? -1 : 1;

    /* ok, need to compare indices now */
    idx_a = fy_node_mapping_get_pair_index(fynp_a->parent, fynp_a);
    idx_b = fy_node_mapping_get_pair_index(fynp_b->parent, fynp_b);

    return idx_a > idx_b ? 1 : (idx_a < idx_b ? -1 : 0);
}